

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O3

ConstantAggregateZero * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::ConstantAggregateZero,LLVMBC::Type*&>
          (LLVMContext *this,Type **u)

{
  ConstantAggregateZero *this_00;
  
  this_00 = (ConstantAggregateZero *)allocate(this,0x38,8);
  if (this_00 != (ConstantAggregateZero *)0x0) {
    ConstantAggregateZero::ConstantAggregateZero(this_00,*u);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}